

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

char * process_pref_file_expr(char **sp,char *fp)

{
  byte bVar1;
  ushort *puVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  void *pvVar6;
  player_class *ppVar7;
  char *pcVar8;
  byte bVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  char *pcVar13;
  byte *__s1;
  char f;
  byte local_49;
  byte *local_48;
  byte *local_40;
  char **local_38;
  
  local_49 = 0x20;
  __s1 = (byte *)*sp;
  local_40 = (byte *)fp;
  local_38 = sp;
  ppuVar4 = __ctype_b_loc();
  puVar2 = *ppuVar4;
  do {
    pbVar12 = __s1;
    __s1 = pbVar12 + 1;
  } while ((*(byte *)((long)puVar2 + (ulong)*pbVar12 * 2 + 1) & 0x20) != 0);
  if (*pbVar12 == 0x5b) {
    local_48 = __s1;
    pcVar5 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
    pcVar13 = "?o?o?";
    if (*pcVar5 != '\0') {
      iVar3 = strcmp(pcVar5,"IOR");
      if (iVar3 == 0) {
        pcVar13 = "0";
        if ((*local_48 != 0) && (local_49 != 0x5d)) {
          pcVar13 = "0";
          do {
            pcVar5 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
            if ((*pcVar5 != '\0') && (iVar3 = strcmp(pcVar5,"0"), iVar3 != 0)) {
              pcVar13 = "1";
            }
          } while ((*local_48 != 0) && (local_49 != 0x5d));
        }
      }
      else {
        iVar3 = strcmp(pcVar5,"AND");
        if (iVar3 == 0) {
          pcVar13 = "1";
          if ((*local_48 != 0) && (local_49 != 0x5d)) {
            pcVar13 = "1";
            do {
              pcVar5 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
              if ((*pcVar5 != '\0') && (iVar3 = strcmp(pcVar5,"0"), iVar3 == 0)) {
                pcVar13 = "0";
              }
            } while ((*local_48 != 0) && (local_49 != 0x5d));
          }
        }
        else {
          iVar3 = strcmp(pcVar5,"NOT");
          if (iVar3 == 0) {
            pcVar13 = "1";
            if ((*local_48 != 0) && (local_49 != 0x5d)) {
              pcVar13 = "1";
              do {
                pcVar5 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
                if ((*pcVar5 != '\0') && (iVar3 = strcmp(pcVar5,"0"), iVar3 != 0)) {
                  pcVar13 = "0";
                }
              } while ((*local_48 != 0) && (local_49 != 0x5d));
            }
          }
          else {
            iVar3 = strcmp(pcVar5,"EQU");
            if (iVar3 == 0) {
              if ((*local_48 != 0) && (local_49 != 0x5d)) {
                pcVar5 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
              }
              pcVar13 = "1";
              if ((*local_48 != 0) && (local_49 != 0x5d)) {
                pcVar13 = "1";
                do {
                  pcVar8 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
                  if ((*pcVar8 != '\0') && (iVar3 = strcmp(pcVar5,pcVar8), iVar3 != 0)) {
                    pcVar13 = "0";
                  }
                } while ((*local_48 != 0) && (pcVar5 = pcVar8, local_49 != 0x5d));
              }
            }
            else {
              iVar3 = strcmp(pcVar5,"LEQ");
              if (iVar3 == 0) {
                if ((*local_48 != 0) && (local_49 != 0x5d)) {
                  pcVar5 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
                }
                pcVar13 = "1";
                if ((*local_48 != 0) && (local_49 != 0x5d)) {
                  pcVar13 = "1";
                  do {
                    pcVar8 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
                    if ((*pcVar8 != '\0') && (iVar3 = strcmp(pcVar5,pcVar8), -1 < iVar3)) {
                      pcVar13 = "0";
                    }
                  } while ((*local_48 != 0) && (pcVar5 = pcVar8, local_49 != 0x5d));
                }
              }
              else {
                iVar3 = strcmp(pcVar5,"GEQ");
                if (iVar3 == 0) {
                  if (local_49 != 0x5d && *local_48 != 0) {
                    pcVar5 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
                  }
                  pcVar13 = "1";
                  if ((*local_48 != 0) && (local_49 != 0x5d)) {
                    pcVar13 = "1";
                    do {
                      pcVar8 = process_pref_file_expr((char **)&local_48,(char *)&local_49);
                      if ((*pcVar8 != '\0') && (iVar3 = strcmp(pcVar5,pcVar8), iVar3 < 1)) {
                        pcVar13 = "0";
                      }
                    } while ((*local_48 != 0) && (pcVar5 = pcVar8, local_49 != 0x5d));
                  }
                }
                else if (local_49 != 0x5d && *local_48 != 0) {
                  do {
                    process_pref_file_expr((char **)&local_48,(char *)&local_49);
                    if (*local_48 == 0) break;
                  } while (local_49 != 0x5d);
                }
              }
            }
          }
        }
      }
    }
    pbVar12 = (byte *)"?x?x?";
    if (local_49 == 0x5d) {
      pbVar12 = (byte *)pcVar13;
    }
    local_49 = *local_48;
    if (local_49 != 0) {
      *local_48 = 0;
      local_48 = local_48 + 1;
    }
  }
  else {
    bVar9 = *pbVar12;
    uVar10 = (ulong)bVar9;
    bVar1 = *(byte *)((long)puVar2 + uVar10 * 2 + 1);
    pbVar11 = pbVar12;
    local_48 = pbVar12;
    while ((bVar1 & 0x40) != 0) {
      bVar9 = (byte)uVar10;
      pvVar6 = memchr(" []",(int)(char)bVar9,4);
      if (pvVar6 != (void *)0x0) break;
      bVar9 = pbVar11[1];
      uVar10 = (ulong)bVar9;
      pbVar11 = pbVar11 + 1;
      bVar1 = *(byte *)((long)puVar2 + uVar10 * 2 + 1);
    }
    local_48 = pbVar11;
    if (bVar9 != 0) {
      local_48 = pbVar11 + 1;
      *pbVar11 = 0;
    }
    local_49 = bVar9;
    if ((*pbVar12 == 0x24) &&
       (iVar3 = strcmp((char *)__s1,"SYS"), pbVar12 = (byte *)ANGBAND_SYS, iVar3 != 0)) {
      iVar3 = strcmp((char *)__s1,"RACE");
      if (iVar3 == 0) {
        ppVar7 = (player_class *)player->race;
      }
      else {
        iVar3 = strcmp((char *)__s1,"CLASS");
        if (iVar3 != 0) {
          pbVar12 = (byte *)"?o?o?";
          goto LAB_001e9a27;
        }
        ppVar7 = player->class;
      }
      pbVar12 = (byte *)ppVar7->name;
    }
  }
LAB_001e9a27:
  *local_40 = local_49;
  *local_38 = (char *)local_48;
  return (char *)pbVar12;
}

Assistant:

static const char *process_pref_file_expr(char **sp, char *fp)
{
	const char *v;

	char *b;
	char *s;

	char f = ' ';

	/* Initial */
	s = (*sp);

	/* Skip spaces */
	while (isspace((unsigned char)*s)) s++;

	/* Save start */
	b = s;

	/* Default */
	v = "?o?o?";

	/* Either the string starts with a [ or it doesn't */
	if (*s == '[') {
		const char *p;
		const char *t;

		/* Skip [ */
		s++;

		/* First */
		t = process_pref_file_expr(&s, &f);

		/* Check all the different types of connective */
		if (!*t) {
			/* Nothing */
		} else if (streq(t, "IOR")) {
			v = "0";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(t, "0")) v = "1";
			}
		} else if (streq(t, "AND")) {
			v = "1";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && streq(t, "0")) v = "0";
			}
		} else if (streq(t, "NOT")) {
			v = "1";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(t, "0")) v = "0";
			}
		} else if (streq(t, "EQU")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(p, t)) v = "0";
			}
		} else if (streq(t, "LEQ")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && (strcmp(p, t) >= 0)) v = "0";
			}
		} else if (streq(t, "GEQ")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && (strcmp(p, t) <= 0)) v = "0";
			}
		} else {
			while (*s && (f != ']')) {
				(void) process_pref_file_expr(&s, &f);
			}
		}

		/* Verify ending */
		if (f != ']') v = "?x?x?";

		/* Extract final and Terminate */
		if ((f = *s) != '\0') *s++ = '\0';
	} else {
		/* Accept all printables except spaces and brackets */
		while (isprint((unsigned char)*s) && !strchr(" []", *s)) ++s;

		/* Extract final and Terminate */
		if ((f = *s) != '\0') *s++ = '\0';

		/* Variables start with $, otherwise it's a constant */
		if (*b == '$') {
			if (streq(b+1, "SYS"))
				v = ANGBAND_SYS;
			else if (streq(b+1, "RACE"))
				v = player->race->name;
			else if (streq(b+1, "CLASS"))
				v = player->class->name;
		} else {
			v = b;
		}
	}

	/* Save */
	(*fp) = f;
	(*sp) = s;

	return v;
}